

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

bool __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::retrieve_symbol_walk
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  bool local_69;
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_68;
  anon_class_56_7_8be982a3 local_48;
  
  local_48.found = &local_69;
  local_69 = false;
  local_48.inlines = inlines;
  local_48.this = this;
  local_48.cu_die = cu_die;
  local_48.pc = pc;
  local_48.dwversion = dwversion;
  local_48.frame = frame;
  std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
  function<cpptrace::detail::libdwarf::dwarf_resolver::retrieve_symbol_walk(cpptrace::detail::libdwarf::die_object_const&,cpptrace::detail::libdwarf::die_object_const&,unsigned_long_long,unsigned_short,cpptrace::stacktrace_frame&,std::vector<cpptrace::stacktrace_frame,std::allocator<cpptrace::stacktrace_frame>>&)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
            ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_68,&local_48);
  walk_die_list(die,&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  return local_69;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        bool retrieve_symbol_walk(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            bool found = false;
            walk_die_list(
                die,
                [this, &cu_die, pc, dwversion, &frame, &inlines, &found] (const die_object& die) {
                    if(dump_dwarf) {
                        std::fprintf(
                            stderr,
                            "-------------> %08llx %s %s\n",
                            to_ull(die.get_global_offset()),
                            die.get_tag_name(),
                            die.get_name().c_str()
                        );
                    }
                    if(!(die.get_tag() == DW_TAG_namespace || die.pc_in_die(cu_die, dwversion, pc))) {
                        if(dump_dwarf) {
                            std::fprintf(stderr, "pc not in die\n");
                        }
                    } else {
                        if(trace_dwarf) {
                            std::fprintf(
                                stderr,
                                "%s %08llx %s\n",
                                die.get_tag() == DW_TAG_namespace ? "pc maybe in die (namespace)" : "pc in die",
                                to_ull(die.get_global_offset()),
                                die.get_tag_name()
                            );
                        }
                        if(die.get_tag() == DW_TAG_subprogram) {
                            frame.symbol = retrieve_symbol_for_subprogram(cu_die, die, pc, dwversion, inlines);
                            found = true;
                            return false;
                        }
                        auto child = die.get_child();
                        if(child) {
                            if(retrieve_symbol_walk(cu_die, child, pc, dwversion, frame, inlines)) {
                                found = true;
                                return false;
                            }
                        } else {
                            if(dump_dwarf) {
                                std::fprintf(stderr, "(no child)\n");
                            }
                        }
                    }
                    return true;
                }
            );
            if(dump_dwarf) {
                std::fprintf(stderr, "End walk_die_list\n");
            }
            return found;
        }